

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O2

bool __thiscall glu::TryCompileProgram::operator()(TryCompileProgram *this,RenderContext *context)

{
  ProgramSources *pPVar1;
  ShaderProgram program;
  allocator<char> local_24a;
  allocator<char> local_249;
  string local_248;
  string local_228;
  undefined1 local_208 [40];
  undefined1 local_1e0 [40];
  ProgramSources local_1b8;
  ShaderProgram local_e8;
  
  memset(&local_1b8,0,0xac);
  local_1b8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1b8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_1b8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_1b8._193_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,this->m_vertexSource,&local_249);
  VertexSource::VertexSource((VertexSource *)local_1e0,&local_228);
  pPVar1 = ProgramSources::operator<<(&local_1b8,(ShaderSource *)local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,this->m_fragmentSource,&local_24a);
  FragmentSource::FragmentSource((FragmentSource *)local_208,&local_248);
  pPVar1 = ProgramSources::operator<<(pPVar1,(ShaderSource *)local_208);
  ShaderProgram::ShaderProgram(&local_e8,context,pPVar1);
  std::__cxx11::string::~string((string *)(local_208 + 8));
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)(local_1e0 + 8));
  std::__cxx11::string::~string((string *)&local_228);
  ProgramSources::~ProgramSources(&local_1b8);
  ShaderProgram::~ShaderProgram(&local_e8);
  return local_e8.m_program.m_info.linkOk;
}

Assistant:

bool operator() (const RenderContext& context) const
	{
		ShaderProgram program(context,
			ProgramSources() << VertexSource(m_vertexSource)
							 << FragmentSource(m_fragmentSource));
		return program.isOk();
	}